

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_suite.cpp
# Opt level: O0

void test_array_integer(void)

{
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_2f8;
  basic_variable<std::allocator<char>_> *local_2e0;
  iterator local_2d0;
  iterator local_2b8;
  iterator local_2a0;
  iterator local_288;
  basic_variable<std::allocator<char>_> *local_270;
  basic_variable<std::allocator<char>_> local_268;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1d8 [24];
  variable expect;
  iterator local_180;
  undefined1 local_168 [8];
  iterator end;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_138,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_108,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_a8,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_78,1);
  local_48._0_8_ = &local_138;
  local_48._8_8_ = 5;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar1 = &local_138;
  local_2e0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_2e0 = local_2e0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2e0);
  } while (local_2e0 != pbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_180,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::unique<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_168,&local_180,(iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_180);
  local_270 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_270,0);
  local_270 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_270,2);
  local_270 = &local_208;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_270,1);
  local_1d8._0_8_ = &local_268;
  local_1d8._8_8_ = 3;
  init_00._M_len = (size_type)pbVar1;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1d8._0_8_,init_00);
  local_2f8 = (basic_variable<std::allocator<char>_> *)local_1d8;
  do {
    local_2f8 = local_2f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2f8);
  } while (local_2f8 != &local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_288,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2a0,(iterator *)local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2b8,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2d0,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/unique_suite.cpp"
             ,0x68,"void test_array_integer()",&local_288,&local_2a0,&local_2b8,&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_integer()
{
    variable data = array::make({ 0, 0, 2, 1, 1 });
    auto end = std::unique(data.begin(), data.end());
    variable expect = array::make({ 0, 2, 1 });
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), end,
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}